

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearScan.cpp
# Opt level: O1

void __thiscall
LinearScan::FillStackLiteralBailOutRecord
          (LinearScan *this,Instr *instr,BailOutInfo *bailOutInfo,FuncBailOutData *funcBailOutData,
          uint funcCount)

{
  uint *puVar1;
  uint uVar2;
  StackSym *pSVar3;
  long lVar4;
  StackLiteralBailOutInfo *pSVar5;
  BailOutRecord *pBVar6;
  StackLiteralBailOutRecord *pSVar7;
  code *pcVar8;
  bool bVar9;
  uint32 uVar10;
  RegSlot RVar11;
  RegSlot RVar12;
  BOOL BVar13;
  undefined4 *puVar14;
  Func *pFVar15;
  JITTimeFunctionBody *pJVar16;
  char *pcVar17;
  long lVar18;
  uint i;
  ulong uVar19;
  
  if (bailOutInfo->stackLiteralBailOutInfoCount != 0) {
    puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    lVar18 = 0;
    uVar19 = 0;
    do {
      pSVar3 = *(StackSym **)((long)&bailOutInfo->stackLiteralBailOutInfo->stackSym + lVar18);
      uVar2 = *(uint *)((long)pSVar3->scratch + 0x78);
      uVar10 = IR::Instr::GetNumber(instr);
      if (uVar10 <= uVar2) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar14 = 1;
        bVar9 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                           ,0x7ea,
                           "(stackSym->scratch.linearScan.lifetime->start < instr->GetNumber())",
                           "stackSym->scratch.linearScan.lifetime->start < instr->GetNumber()");
        if (!bVar9) goto LAB_0058d1b8;
        *puVar14 = 0;
      }
      uVar2 = *(uint *)((long)pSVar3->scratch + 0x7c);
      uVar10 = IR::Instr::GetNumber(instr);
      if (uVar2 < uVar10) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar14 = 1;
        bVar9 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                           ,0x7eb,
                           "(stackSym->scratch.linearScan.lifetime->end >= instr->GetNumber())",
                           "stackSym->scratch.linearScan.lifetime->end >= instr->GetNumber()");
        if (!bVar9) goto LAB_0058d1b8;
        *puVar14 = 0;
      }
      RVar11 = StackSym::GetByteCodeRegSlot(pSVar3);
      pFVar15 = StackSym::GetByteCodeFunc(pSVar3);
      uVar2 = pFVar15->inlineDepth;
      if (RVar11 == 0xffffffff) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar14 = 1;
        bVar9 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                           ,0x7f1,"(regSlot != Js::Constants::NoRegister)",
                           "regSlot != Js::Constants::NoRegister");
        if (!bVar9) goto LAB_0058d1b8;
        *puVar14 = 0;
      }
      pJVar16 = JITTimeWorkItem::GetJITFunctionBody(pFVar15->m_workItem);
      RVar12 = JITTimeFunctionBody::GetLocalsCount(pJVar16);
      if (RVar12 <= RVar11) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar14 = 1;
        bVar9 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                           ,0x7f2,"(regSlot < stackSymFunc->GetJITFunctionBody()->GetLocalsCount())"
                           ,"regSlot < stackSymFunc->GetJITFunctionBody()->GetLocalsCount()");
        if (!bVar9) goto LAB_0058d1b8;
        *puVar14 = 0;
      }
      if (funcCount <= uVar2) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar14 = 1;
        bVar9 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                           ,0x7f3,"(index < funcCount)","index < funcCount");
        if (!bVar9) goto LAB_0058d1b8;
        *puVar14 = 0;
      }
      if (funcBailOutData[uVar2].func != pFVar15) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar14 = 1;
        bVar9 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                           ,0x7f4,"(funcBailOutData[index].func == stackSymFunc)",
                           "funcBailOutData[index].func == stackSymFunc");
        if (!bVar9) goto LAB_0058d1b8;
        *puVar14 = 0;
      }
      if (funcBailOutData[uVar2].localOffsets[RVar11] == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar14 = 1;
        bVar9 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                           ,0x7f5,"(funcBailOutData[index].localOffsets[regSlot] != 0)",
                           "funcBailOutData[index].localOffsets[regSlot] != 0");
        if (!bVar9) goto LAB_0058d1b8;
        *puVar14 = 0;
      }
      puVar1 = &(funcBailOutData[uVar2].bailOutRecord)->stackLiteralBailOutRecordCount;
      *puVar1 = *puVar1 + 1;
      uVar19 = uVar19 + 1;
      lVar18 = lVar18 + 0x10;
    } while (uVar19 < bailOutInfo->stackLiteralBailOutInfoCount);
    if (funcCount != 0) {
      pFVar15 = this->func->topFunc;
      puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      lVar18 = 0;
      do {
        uVar19 = (ulong)*(uint *)(*(long *)((long)&funcBailOutData->bailOutRecord + lVar18) + 0x38);
        if (uVar19 != 0) {
          BVar13 = ExceptionCheck::CanHandleOutOfMemory();
          if (BVar13 == 0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar14 = 1;
            bVar9 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                               ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                               "ExceptionCheck::CanHandleOutOfMemory()");
            if (!bVar9) goto LAB_0058d1b8;
            *puVar14 = 0;
          }
          pcVar17 = NativeCodeData::Allocator::Alloc(&pFVar15->nativeCodeDataAllocator,uVar19 << 3);
          if (pcVar17 == (char *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar14 = 1;
            bVar9 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                               ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
            if (!bVar9) goto LAB_0058d1b8;
            *puVar14 = 0;
          }
          lVar4 = *(long *)((long)&funcBailOutData->bailOutRecord + lVar18);
          *(char **)(lVar4 + 0x28) = pcVar17;
          *(undefined4 *)(lVar4 + 0x38) = 0;
        }
        lVar18 = lVar18 + 0x28;
      } while ((ulong)funcCount * 0x28 != lVar18);
    }
    if (bailOutInfo->stackLiteralBailOutInfoCount != 0) {
      lVar18 = 8;
      puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      uVar19 = 0;
      do {
        pSVar5 = bailOutInfo->stackLiteralBailOutInfo;
        pSVar3 = *(StackSym **)((long)pSVar5 + lVar18 + -8);
        uVar2 = *(uint *)((long)pSVar3->scratch + 0x78);
        uVar10 = IR::Instr::GetNumber(instr);
        if (uVar10 <= uVar2) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar14 = 1;
          bVar9 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                             ,0x7ea,
                             "(stackSym->scratch.linearScan.lifetime->start < instr->GetNumber())",
                             "stackSym->scratch.linearScan.lifetime->start < instr->GetNumber()");
          if (!bVar9) {
LAB_0058d1b8:
            pcVar8 = (code *)invalidInstructionException();
            (*pcVar8)();
          }
          *puVar14 = 0;
        }
        uVar2 = *(uint *)((long)pSVar3->scratch + 0x7c);
        uVar10 = IR::Instr::GetNumber(instr);
        if (uVar2 < uVar10) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar14 = 1;
          bVar9 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                             ,0x7eb,
                             "(stackSym->scratch.linearScan.lifetime->end >= instr->GetNumber())",
                             "stackSym->scratch.linearScan.lifetime->end >= instr->GetNumber()");
          if (!bVar9) goto LAB_0058d1b8;
          *puVar14 = 0;
        }
        RVar11 = StackSym::GetByteCodeRegSlot(pSVar3);
        pFVar15 = StackSym::GetByteCodeFunc(pSVar3);
        uVar2 = pFVar15->inlineDepth;
        if (RVar11 == 0xffffffff) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar14 = 1;
          bVar9 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                             ,0x7f1,"(regSlot != Js::Constants::NoRegister)",
                             "regSlot != Js::Constants::NoRegister");
          if (!bVar9) goto LAB_0058d1b8;
          *puVar14 = 0;
        }
        pJVar16 = JITTimeWorkItem::GetJITFunctionBody(pFVar15->m_workItem);
        RVar12 = JITTimeFunctionBody::GetLocalsCount(pJVar16);
        if (RVar12 <= RVar11) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar14 = 1;
          bVar9 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                             ,0x7f2,
                             "(regSlot < stackSymFunc->GetJITFunctionBody()->GetLocalsCount())",
                             "regSlot < stackSymFunc->GetJITFunctionBody()->GetLocalsCount()");
          if (!bVar9) goto LAB_0058d1b8;
          *puVar14 = 0;
        }
        if (funcCount <= uVar2) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar14 = 1;
          bVar9 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                             ,0x7f3,"(index < funcCount)","index < funcCount");
          if (!bVar9) goto LAB_0058d1b8;
          *puVar14 = 0;
        }
        if (funcBailOutData[uVar2].func != pFVar15) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar14 = 1;
          bVar9 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                             ,0x7f4,"(funcBailOutData[index].func == stackSymFunc)",
                             "funcBailOutData[index].func == stackSymFunc");
          if (!bVar9) goto LAB_0058d1b8;
          *puVar14 = 0;
        }
        if (funcBailOutData[uVar2].localOffsets[RVar11] == 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar14 = 1;
          bVar9 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                             ,0x7f5,"(funcBailOutData[index].localOffsets[regSlot] != 0)",
                             "funcBailOutData[index].localOffsets[regSlot] != 0");
          if (!bVar9) goto LAB_0058d1b8;
          *puVar14 = 0;
        }
        pBVar6 = funcBailOutData[uVar2].bailOutRecord;
        pSVar7 = pBVar6->stackLiteralBailOutRecord;
        uVar2 = pBVar6->stackLiteralBailOutRecordCount;
        pBVar6->stackLiteralBailOutRecordCount = uVar2 + 1;
        pSVar7[uVar2].regSlot = RVar11;
        pSVar7[uVar2].initFldCount = *(uint *)((long)&pSVar5->stackSym + lVar18);
        uVar19 = uVar19 + 1;
        lVar18 = lVar18 + 0x10;
      } while (uVar19 < bailOutInfo->stackLiteralBailOutInfoCount);
    }
  }
  return;
}

Assistant:

void
LinearScan::FillStackLiteralBailOutRecord(IR::Instr * instr, BailOutInfo * bailOutInfo, FuncBailOutData * funcBailOutData, uint funcCount)
{
    if (bailOutInfo->stackLiteralBailOutInfoCount)
    {
        // Count the data
        ForEachStackLiteralBailOutInfo(instr, bailOutInfo, funcBailOutData, funcCount,
            [=](uint funcIndex, BailOutInfo::StackLiteralBailOutInfo& stackLiteralBailOutInfo, Js::RegSlot regSlot)
        {
            funcBailOutData[funcIndex].bailOutRecord->stackLiteralBailOutRecordCount++;
        });

        // Allocate the data
        NativeCodeData::Allocator * allocator = this->func->GetNativeCodeDataAllocator();
        for (uint i = 0; i < funcCount; i++)
        {
            uint stackLiteralBailOutRecordCount = funcBailOutData[i].bailOutRecord->stackLiteralBailOutRecordCount;
            if (stackLiteralBailOutRecordCount)
            {
                funcBailOutData[i].bailOutRecord->stackLiteralBailOutRecord =
                    NativeCodeDataNewArrayNoFixup(allocator, BailOutRecord::StackLiteralBailOutRecord, stackLiteralBailOutRecordCount);
                // reset the count so we can track how much we have filled below
                funcBailOutData[i].bailOutRecord->stackLiteralBailOutRecordCount = 0;
            }
        }

        // Fill out the data
        ForEachStackLiteralBailOutInfo(instr, bailOutInfo, funcBailOutData, funcCount,
            [=](uint funcIndex, BailOutInfo::StackLiteralBailOutInfo& stackLiteralBailOutInfo, Js::RegSlot regSlot)
        {
            uint& recordIndex = funcBailOutData[funcIndex].bailOutRecord->stackLiteralBailOutRecordCount;
            BailOutRecord::StackLiteralBailOutRecord& stackLiteralBailOutRecord =
                funcBailOutData[funcIndex].bailOutRecord->stackLiteralBailOutRecord[recordIndex++];
            stackLiteralBailOutRecord.regSlot = regSlot;
            stackLiteralBailOutRecord.initFldCount = stackLiteralBailOutInfo.initFldCount;
        });
    }
}